

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChConstraintTwo.cpp
# Opt level: O1

ChConstraintTwo * __thiscall
chrono::ChConstraintTwo::operator=(ChConstraintTwo *this,ChConstraintTwo *other)

{
  if (other != this) {
    ChConstraint::operator=(&this->super_ChConstraint,&other->super_ChConstraint);
    this->variables_a = other->variables_a;
    this->variables_b = other->variables_b;
  }
  return this;
}

Assistant:

ChConstraintTwo& ChConstraintTwo::operator=(const ChConstraintTwo& other) {
    if (&other == this)
        return *this;

    // copy parent class data
    ChConstraint::operator=(other);

    this->variables_a = other.variables_a;
    this->variables_b = other.variables_b;

    return *this;
}